

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

void my_sleep(int sec)

{
  int sec_local;
  
  sleep(sec);
  return;
}

Assistant:

static void my_sleep(int sec) {
#ifdef __helenos__
	fibril_sleep(sec);
#else
#if defined(__unix) || defined(__APPLE__)
	sleep(sec);
#endif
#if defined(__WIN64) || defined(__WIN32) || defined(_WIN32)
	Sleep(1000 * sec);
#endif
#endif
}